

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eci.cc
# Opt level: O3

void __thiscall libsgp4::Eci::ToEci(Eci *this,DateTime *dt,CoordGeodetic *geo)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  
  (this->m_dt).m_encoded = dt->m_encoded;
  dVar1 = geo->longitude;
  dVar4 = DateTime::ToGreenwichSiderealTime(&this->m_dt);
  dVar4 = dVar4 + dVar1;
  dVar1 = floor(dVar4 / 6.283185307179586);
  dVar4 = dVar1 * -6.283185307179586 + dVar4;
  dVar1 = sin(geo->latitude);
  dVar1 = dVar1 * dVar1 * -0.006694317778266723 + 1.0;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar2 = geo->altitude;
  dVar5 = cos(geo->latitude);
  dVar5 = dVar5 * ((1.0 / dVar1) * 6378.135 + dVar2);
  dVar2 = cos(dVar4);
  (this->m_position).x = dVar2 * dVar5;
  dVar4 = sin(dVar4);
  (this->m_position).y = dVar4 * dVar5;
  dVar4 = geo->altitude;
  dVar2 = sin(geo->latitude);
  dVar2 = dVar2 * ((1.0 / dVar1) * 0.9933056822217334 * 6378.135 + dVar4);
  (this->m_position).z = dVar2;
  dVar1 = (this->m_position).x;
  dVar4 = (this->m_position).y;
  dVar5 = dVar1 * 7.292115855228083e-05;
  dVar6 = dVar4 * -7.292115855228083e-05;
  (this->m_position).w = SQRT(dVar2 * dVar2 + dVar1 * dVar1 + dVar4 * dVar4);
  auVar3._8_4_ = SUB84(dVar5,0);
  auVar3._0_8_ = dVar6;
  auVar3._12_4_ = (int)((ulong)dVar5 >> 0x20);
  (this->m_velocity).x = dVar6;
  (this->m_velocity).y = (double)auVar3._8_8_;
  (this->m_velocity).z = 0.0;
  (this->m_velocity).w = SQRT(dVar6 * dVar6 + dVar5 * dVar5);
  return;
}

Assistant:

void Eci::ToEci(const DateTime& dt, const CoordGeodetic &geo)
{
    /*
     * set date
     */
    m_dt = dt;

    static const double mfactor = kTWOPI * (kOMEGA_E / kSECONDS_PER_DAY);

    /*
     * Calculate Local Mean Sidereal Time for observers longitude
     */
    const double theta = m_dt.ToLocalMeanSiderealTime(geo.longitude);

    /*
     * take into account earth flattening
     */
    const double c = 1.0
        / sqrt(1.0 + kF * (kF - 2.0) * pow(sin(geo.latitude), 2.0));
    const double s = pow(1.0 - kF, 2.0) * c;
    const double achcp = (kXKMPER * c + geo.altitude) * cos(geo.latitude);

    /*
     * X position in km
     * Y position in km
     * Z position in km
     * W magnitude in km
     */
    m_position.x = achcp * cos(theta);
    m_position.y = achcp * sin(theta);
    m_position.z = (kXKMPER * s + geo.altitude) * sin(geo.latitude);
    m_position.w = m_position.Magnitude();

    /*
     * X velocity in km/s
     * Y velocity in km/s
     * Z velocity in km/s
     * W magnitude in km/s
     */
    m_velocity.x = -mfactor * m_position.y;
    m_velocity.y = mfactor * m_position.x;
    m_velocity.z = 0.0;
    m_velocity.w = m_velocity.Magnitude();
}